

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

void jsonnet::internal::fodder_push_back(Fodder *a,FodderElement *elem)

{
  pointer pFVar1;
  Kind KVar2;
  bool bVar3;
  int local_30 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  pFVar1 = (a->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((a->
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      )._M_impl.super__Vector_impl_data._M_start == pFVar1) {
    KVar2 = elem->kind;
    bVar3 = true;
  }
  else {
    KVar2 = elem->kind;
    if (KVar2 == LINE_END && pFVar1[-1].kind != INTERSTITIAL) {
      if ((elem->comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (elem->comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_28.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_28.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
        std::
        vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>::
        emplace_back<jsonnet::internal::FodderElement::Kind,unsigned_int_const&,unsigned_int_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                  ((vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
                    *)a,(Kind *)&local_28,&elem->blanks,&elem->indent,&elem->comment);
        return;
      }
      pFVar1[-1].indent = elem->indent;
      pFVar1[-1].blanks = pFVar1[-1].blanks + elem->blanks;
      return;
    }
    bVar3 = pFVar1[-1].kind == INTERSTITIAL;
  }
  if ((bVar3) && (KVar2 == PARAGRAPH)) {
    local_30[1] = 0;
    local_30[0] = 0;
    local_28.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>::
    emplace_back<jsonnet::internal::FodderElement::Kind,int,unsigned_int_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
                *)a,(Kind *)(local_30 + 1),local_30,&elem->indent,&local_28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  push_back(a,elem);
  return;
}

Assistant:

static inline void fodder_push_back(Fodder &a, const FodderElement &elem)
{
    if (fodder_has_clean_endline(a) && elem.kind == FodderElement::LINE_END) {
        if (elem.comment.size() > 0) {
            // The line end had a comment, so create a single line paragraph for it.
            a.emplace_back(FodderElement::PARAGRAPH, elem.blanks, elem.indent, elem.comment);
        } else {
            // Merge it into the previous line end.
            a.back().indent = elem.indent;
            a.back().blanks += elem.blanks;
        }
    } else {
        if (!fodder_has_clean_endline(a) && elem.kind == FodderElement::PARAGRAPH) {
            a.emplace_back(FodderElement::LINE_END, 0, elem.indent, std::vector<std::string>());
        }
        a.push_back(elem);
    }
}